

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O3

bool __thiscall QGroupBox::event(QGroupBox *this,QEvent *e)

{
  bool bVar1;
  ushort uVar2;
  SubControl SVar3;
  QGroupBoxPrivate *this_00;
  QRect QVar4;
  QRect QVar5;
  QRect QVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  QStyle *pQVar10;
  QKeyEvent *k;
  long in_FS_OFFSET;
  double dVar11;
  undefined1 auVar12 [16];
  QStyleOptionGroupBox box;
  QRect local_e8;
  QRect local_d8;
  QRect local_c8;
  QStyleOptionGroupBox local_b8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGroupBoxPrivate **)&(this->super_QWidget).field_0x8;
  if ((*(short *)(e + 8) == 0x75) && (*(int *)(e + 0x18) == this_00->shortcutId)) {
    if (this_00->checkable == false) {
      QGroupBoxPrivate::_q_fixFocus(this_00,ShortcutFocusReason);
    }
    else {
      QGroupBoxPrivate::click(this_00);
      QWidget::setFocus(&this->super_QWidget,ShortcutFocusReason);
    }
    bVar8 = true;
    goto LAB_0040af75;
  }
  memset(&local_b8,0xaa,0x88);
  QStyleOptionGroupBox::QStyleOptionGroupBox(&local_b8);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&local_b8);
  QVar6.x2.m_i = local_c8.x2.m_i;
  QVar6.y2.m_i = local_c8.y2.m_i;
  QVar6.x1.m_i = local_c8.x1.m_i;
  QVar6.y1.m_i = local_c8.y1.m_i;
  QVar5.x2.m_i = local_d8.x2.m_i;
  QVar5.y2.m_i = local_d8.y2.m_i;
  QVar5.x1.m_i = local_d8.x1.m_i;
  QVar5.y1.m_i = local_d8.y1.m_i;
  QVar4.x2.m_i = local_e8.x2.m_i;
  QVar4.y2.m_i = local_e8.y2.m_i;
  QVar4.x1.m_i = local_e8.x1.m_i;
  QVar4.y1.m_i = local_e8.y1.m_i;
  uVar2 = *(ushort *)(e + 8);
  if (uVar2 < 0x7f) {
    if (uVar2 == 6) {
      bVar8 = QGroupBoxPrivate::shouldHandleKeyEvent(this_00,(QKeyEvent *)e);
      if (!bVar8) goto LAB_0040af23;
      this_00->pressedControl = SC_ComboBoxFrame;
      pQVar10 = QWidget::style(&this->super_QWidget);
      local_c8 = (QRect)(**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,7,&local_b8,1,this);
      QWidget::update(&this->super_QWidget,&local_c8);
      QVar5.x2.m_i = local_d8.x2.m_i;
      QVar5.y2.m_i = local_d8.y2.m_i;
      QVar5.x1.m_i = local_d8.x1.m_i;
      QVar5.y1.m_i = local_d8.y1.m_i;
      QVar4.x2.m_i = local_e8.x2.m_i;
      QVar4.y2.m_i = local_e8.y2.m_i;
      QVar4.x1.m_i = local_e8.x1.m_i;
      QVar4.y1.m_i = local_e8.y1.m_i;
      bVar8 = true;
      QVar6 = local_c8;
    }
    else {
      if (uVar2 == 7) {
        bVar8 = QGroupBoxPrivate::shouldHandleKeyEvent(this_00,(QKeyEvent *)e);
        QVar6.x2.m_i = local_c8.x2.m_i;
        QVar6.y2.m_i = local_c8.y2.m_i;
        QVar6.x1.m_i = local_c8.x1.m_i;
        QVar6.y1.m_i = local_c8.y1.m_i;
        QVar5.x2.m_i = local_d8.x2.m_i;
        QVar5.y2.m_i = local_d8.y2.m_i;
        QVar5.x1.m_i = local_d8.x1.m_i;
        QVar5.y1.m_i = local_d8.y1.m_i;
        QVar4.x2.m_i = local_e8.x2.m_i;
        QVar4.y2.m_i = local_e8.y2.m_i;
        QVar4.x1.m_i = local_e8.x1.m_i;
        QVar4.y1.m_i = local_e8.y1.m_i;
        if (bVar8) {
          SVar3 = this_00->pressedControl;
          this_00->pressedControl = SC_None;
          bVar8 = true;
          if (SVar3 - SC_ComboBoxFrame < 2) {
            QGroupBoxPrivate::click(this_00);
            QVar6.x2.m_i = local_c8.x2.m_i;
            QVar6.y2.m_i = local_c8.y2.m_i;
            QVar6.x1.m_i = local_c8.x1.m_i;
            QVar6.y1.m_i = local_c8.y1.m_i;
            QVar5.x2.m_i = local_d8.x2.m_i;
            QVar5.y2.m_i = local_d8.y2.m_i;
            QVar5.x1.m_i = local_d8.x1.m_i;
            QVar5.y1.m_i = local_d8.y1.m_i;
            QVar4.x2.m_i = local_e8.x2.m_i;
            QVar4.y2.m_i = local_e8.y2.m_i;
            QVar4.x1.m_i = local_e8.x1.m_i;
            QVar4.y1.m_i = local_e8.y1.m_i;
          }
          goto LAB_0040af30;
        }
      }
LAB_0040af23:
      bVar8 = QWidget::event(&this->super_QWidget,e);
      QVar6.x2.m_i = local_c8.x2.m_i;
      QVar6.y2.m_i = local_c8.y2.m_i;
      QVar6.x1.m_i = local_c8.x1.m_i;
      QVar6.y1.m_i = local_c8.y1.m_i;
      QVar5.x2.m_i = local_d8.x2.m_i;
      QVar5.y2.m_i = local_d8.y2.m_i;
      QVar5.x1.m_i = local_d8.x1.m_i;
      QVar5.y1.m_i = local_d8.y1.m_i;
      QVar4.x2.m_i = local_e8.x2.m_i;
      QVar4.y2.m_i = local_e8.y2.m_i;
      QVar4.x1.m_i = local_e8.x1.m_i;
      QVar4.y1.m_i = local_e8.y1.m_i;
    }
  }
  else {
    if (uVar2 == 0x81) {
LAB_0040acf7:
      pQVar10 = QWidget::style(&this->super_QWidget);
      auVar12 = QEventPoint::position();
      dVar11 = (double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar12._0_8_;
      bVar8 = 2147483647.0 < dVar11;
      if (dVar11 <= -2147483648.0) {
        dVar11 = -2147483648.0;
      }
      local_c8.x1.m_i =
           (int)(double)(-(ulong)bVar8 & 0x41dfffffffc00000 | ~-(ulong)bVar8 & (ulong)dVar11);
      dVar11 = (double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar12._8_8_;
      bVar8 = 2147483647.0 < dVar11;
      if (dVar11 <= -2147483648.0) {
        dVar11 = -2147483648.0;
      }
      local_c8.y1.m_i =
           (int)(double)(-(ulong)bVar8 & 0x41dfffffffc00000 | ~-(ulong)bVar8 & (ulong)dVar11);
      iVar9 = (**(code **)(*(long *)pQVar10 + 0xd0))(pQVar10,7,&local_b8,&local_c8,this);
      QVar6.x2.m_i = local_c8.x2.m_i;
      QVar6.y2.m_i = local_c8.y2.m_i;
      QVar6.x1.m_i = local_c8.x1.m_i;
      QVar6.y1.m_i = local_c8.y1.m_i;
      QVar5.x2.m_i = local_d8.x2.m_i;
      QVar5.y2.m_i = local_d8.y2.m_i;
      QVar5.x1.m_i = local_d8.x1.m_i;
      QVar5.y1.m_i = local_d8.y1.m_i;
      QVar4.x2.m_i = local_e8.x2.m_i;
      QVar4.y2.m_i = local_e8.y2.m_i;
      QVar4.x1.m_i = local_e8.x1.m_i;
      QVar4.y1.m_i = local_e8.y1.m_i;
      bVar7 = (bool)(iVar9 - 1U < 2 & this_00->checkable);
      bVar1 = this_00->hover;
      this_00->hover = bVar7;
      bVar8 = true;
      if (bVar1 == bVar7) goto LAB_0040af30;
    }
    else {
      if (uVar2 != 0x80) {
        if (uVar2 != 0x7f) goto LAB_0040af23;
        goto LAB_0040acf7;
      }
      this_00->hover = false;
      bVar8 = true;
      if (this_00->checkable != true) goto LAB_0040af30;
    }
    bVar8 = true;
    pQVar10 = QWidget::style(&this->super_QWidget);
    local_d8 = (QRect)(**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,7,&local_b8,1,this);
    pQVar10 = QWidget::style(&this->super_QWidget);
    local_e8 = (QRect)(**(code **)(*(long *)pQVar10 + 0xd8))(pQVar10,7,&local_b8,2,this);
    local_c8 = (QRect)QRect::operator|(&local_d8,&local_e8);
    QWidget::update(&this->super_QWidget,&local_c8);
    QVar4 = local_e8;
    QVar5 = local_d8;
    QVar6 = local_c8;
  }
LAB_0040af30:
  local_e8 = QVar4;
  local_d8 = QVar5;
  local_c8 = QVar6;
  if (&(local_b8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
LAB_0040af75:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QGroupBox::event(QEvent *e)
{
    Q_D(QGroupBox);
#ifndef QT_NO_SHORTCUT
    if (e->type() == QEvent::Shortcut) {
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        if (se->shortcutId() == d->shortcutId) {
            if (!isCheckable()) {
                d->_q_fixFocus(Qt::ShortcutFocusReason);
            } else {
                d->click();
                setFocus(Qt::ShortcutFocusReason);
            }
            return true;
        }
    }
#endif
    QStyleOptionGroupBox box;
    initStyleOption(&box);
    switch (e->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverMove: {
        QStyle::SubControl control = style()->hitTestComplexControl(QStyle::CC_GroupBox, &box,
                                                                    static_cast<QHoverEvent *>(e)->position().toPoint(),
                                                                    this);
        bool oldHover = d->hover;
        d->hover = d->checkable && (control == QStyle::SC_GroupBoxLabel || control == QStyle::SC_GroupBoxCheckBox);
        if (oldHover != d->hover) {
            QRect rect = style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this)
                         | style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxLabel, this);
            update(rect);
        }
        return true;
    }
    case QEvent::HoverLeave:
        d->hover = false;
        if (d->checkable) {
            QRect rect = style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this)
                         | style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxLabel, this);
            update(rect);
        }
        return true;
    case QEvent::KeyPress: {
        QKeyEvent *k = static_cast<QKeyEvent*>(e);
        if (d->shouldHandleKeyEvent(k)) {
            d->pressedControl = QStyle::SC_GroupBoxCheckBox;
            update(style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxCheckBox, this));
            return true;
        }
        break;
    }
    case QEvent::KeyRelease: {
        QKeyEvent *k = static_cast<QKeyEvent*>(e);
        if (d->shouldHandleKeyEvent(k)) {
            bool toggle = (d->pressedControl == QStyle::SC_GroupBoxLabel
                           || d->pressedControl == QStyle::SC_GroupBoxCheckBox);
            d->pressedControl = QStyle::SC_None;
            if (toggle)
                d->click();
            return true;
        }
        break;
    }
    default:
        break;
    }
    return QWidget::event(e);
}